

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply_element ply_find_element(p_ply ply,char *name)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  char *in_RSI;
  long in_RDI;
  int nelements;
  int i;
  p_ply_element element;
  int local_24;
  
  lVar1 = *(long *)(in_RDI + 8);
  uVar2 = *(undefined8 *)(in_RDI + 0x10);
  local_24 = 0;
  while( true ) {
    if ((int)uVar2 <= local_24) {
      return (p_ply_element)0x0;
    }
    iVar3 = strcmp((char *)(lVar1 + (long)local_24 * 0x118),in_RSI);
    if (iVar3 == 0) break;
    local_24 = local_24 + 1;
  }
  return (p_ply_element)(lVar1 + (long)local_24 * 0x118);
}

Assistant:

static p_ply_element ply_find_element(p_ply ply, const char *name) {
    p_ply_element element;
    int i, nelements;
    assert(ply && name);
    element = ply->element;
    nelements = ply->nelements;
    assert(element || nelements == 0);
    assert(!element || nelements > 0);
    for (i = 0; i < nelements; i++)
        if (!strcmp(element[i].name, name)) return &element[i];
    return NULL;
}